

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O0

pair<bool,_int>
jsoncons::
json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::pair<bool,_int>,_void>
::as(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  type_conflict9 tVar1;
  type_conflict tVar2;
  pair<bool,_int> pVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 uVar4;
  
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
            (in_RDI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  tVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<bool>(in_RDI);
  uVar4 = CONCAT13(tVar1,(int3)in_stack_ffffffffffffffec);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
            (in_RDI,CONCAT44(uVar4,in_stack_ffffffffffffffe8));
  tVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<int>(in_RDI);
  pVar3 = std::make_pair<bool,int>((bool *)CONCAT44(uVar4,tVar2),(int *)0xd165cc);
  return pVar3;
}

Assistant:

static std::pair<T1,T2> as(const Json& j)
        {
            return std::make_pair<T1,T2>(j[0].template as<T1>(),j[1].template as<T2>());
        }